

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

void __thiscall QDateTime::setMSecsSinceEpoch(QDateTime *this,qint64 msecs)

{
  QDateTimePrivate *pQVar1;
  QDateTimePrivate *pQVar2;
  undefined8 uVar3;
  QDateTimePrivate *pQVar4;
  uint uVar5;
  int iVar6;
  Int IVar7;
  uint uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  ZoneState local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    IVar7 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    IVar7 = (Int)(byte)pQVar1;
  }
  uVar5 = IVar7 >> 4 & 3;
  uVar8 = IVar7 & 0xfffffff1;
  iVar6 = 0;
  if (uVar5 - 1 < 2) {
    if (uVar5 == 2) {
      iVar6 = pQVar1->m_offsetFromUtc;
    }
    local_50.offset = iVar6;
    if ((iVar6 == 0) ||
       (bVar9 = SCARRY8(msecs,(long)iVar6 * 1000), msecs = msecs + (long)iVar6 * 1000, !bVar9)) {
LAB_0016658a:
      uVar8 = IVar7 | 0xe;
      iVar6 = local_50.offset;
    }
  }
  else if ((uVar5 == 0) &&
          (QDateTimePrivate::expressUtcAsLocal(&local_50,msecs), msecs = local_50.when,
          iVar6 = local_50.offset, (local_50.valid & 1U) != 0)) {
    IVar7 = IVar7 & 0xffffff31;
    if (local_50.dst == StandardTime) {
      uVar8 = IVar7 | 0x4e;
    }
    else {
      if (local_50.dst != DaylightTime) goto LAB_0016658a;
      uVar8 = IVar7 | 0x8e;
    }
  }
  if ((msecs + 0x80000000000000U >> 0x38 == 0) && (((ulong)this->d & 1) != 0)) {
    (this->d).d = (QDateTimePrivate *)((ulong)(uVar8 & 0xff) | msecs << 8);
    goto LAB_00166691;
  }
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> != 1) {
      pQVar4 = (QDateTimePrivate *)operator_new(0x20);
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      uVar3 = *(undefined8 *)((long)&pQVar1->m_msecs + 4);
      *(undefined8 *)&pQVar4->m_status = *(undefined8 *)&pQVar1->m_status;
      *(undefined8 *)((long)&pQVar4->m_msecs + 4) = uVar3;
      QTimeZone::QTimeZone(&pQVar4->m_timeZone,&pQVar1->m_timeZone);
      goto LAB_00166632;
    }
  }
  else {
    pQVar4 = (QDateTimePrivate *)operator_new(0x20);
    pQVar4->super_QSharedData = (QAtomicInt)0x0;
    pQVar4->m_status = (QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)0x0;
    pQVar4->m_msecs = 0;
    pQVar4->m_offsetFromUtc = 0;
    QTimeZone::QTimeZone(&pQVar4->m_timeZone);
    pQVar2 = (this->d).d;
    (pQVar4->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = (int)(char)pQVar2 & 0xfffffffe;
    pQVar4->m_msecs = (long)pQVar2 >> 8;
LAB_00166632:
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 1;
    if (((ulong)pQVar1 & 1) == 0) {
      pQVar1 = (this->d).d;
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if (((__int_type)
           (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int> == 0) &&
         (pQVar1 = (this->d).d, pQVar1 != (QDateTimePrivate *)0x0)) {
        QTimeZone::~QTimeZone(&pQVar1->m_timeZone);
        operator_delete(pQVar1,0x20);
      }
    }
    (this->d).d = pQVar4;
  }
  (((this->d).d)->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = uVar8 & 0xfffffffe;
  ((this->d).d)->m_msecs = msecs;
  ((this->d).d)->m_offsetFromUtc = iVar6;
LAB_00166691:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTime::setMSecsSinceEpoch(qint64 msecs)
{
    auto status = getStatus(d);
    const auto spec = extractSpec(status);
    Q_ASSERT(specCanBeSmall(spec) || !d.isShort());
    QDateTimePrivate::ZoneState state(msecs);

    status &= ~QDateTimePrivate::ValidityMask;
    if (QTimeZone::isUtcOrFixedOffset(spec)) {
        if (spec == Qt::OffsetFromUTC)
            state.offset = d->m_offsetFromUtc;
        if (!state.offset || !qAddOverflow(msecs, state.offset * MSECS_PER_SEC, &state.when))
            status |= QDateTimePrivate::ValidityMask;
    } else if (spec == Qt::LocalTime) {
        state = QDateTimePrivate::expressUtcAsLocal(msecs);
        if (state.valid)
            status = mergeDaylightStatus(status | QDateTimePrivate::ValidityMask, state.dst);
#if QT_CONFIG(timezone)
    } else if (spec == Qt::TimeZone && (d.detach(), d->m_timeZone.isValid())) {
        const auto data = d->m_timeZone.d->data(msecs);
        if (Q_LIKELY(data.offsetFromUtc != QTimeZonePrivate::invalidSeconds())) {
            state.offset = data.offsetFromUtc;
            Q_ASSERT(state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY);
            if (!state.offset
                || !Q_UNLIKELY(qAddOverflow(msecs, state.offset * MSECS_PER_SEC, &state.when))) {
                d->m_status = mergeDaylightStatus(status | QDateTimePrivate::ValidityMask,
                                                  data.daylightTimeOffset
                                                  ? QDateTimePrivate::DaylightTime
                                                  : QDateTimePrivate::StandardTime);
                d->m_msecs = state.when;
                d->m_offsetFromUtc = state.offset;
                return;
            } // else: zone can't represent this UTC time
        } // else: zone unable to represent given UTC time (should only happen on overflow).
#endif // timezone
    }
    Q_ASSERT(!status.testFlag(QDateTimePrivate::ValidDateTime)
             || (state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY));

    if (msecsCanBeSmall(state.when) && d.isShort()) {
        // we can keep short
        d.data.msecs = qintptr(state.when);
        d.data.status = status.toInt();
    } else {
        d.detach();
        d->m_status = status & ~QDateTimePrivate::ShortData;
        d->m_msecs = state.when;
        d->m_offsetFromUtc = state.offset;
    }
}